

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O0

void __thiscall
CLPIParser::composeEP_map_for_one_stream_PID
          (CLPIParser *this,BitStreamWriter *writer,M2TSStreamInfo *streamInfo)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  reference pBVar6;
  reference this_00;
  reference __in;
  type *ptVar7;
  type *ptVar8;
  uint local_bc;
  int endCode;
  PMTIndexData *indexData;
  type *snd;
  type *fst;
  _Self local_98;
  const_iterator __end2;
  const_iterator __begin2;
  PMTIndex *__range2;
  PMTIndex *curIndex;
  BluRayCoarseInfo *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> *__range1;
  vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> coarseInfo;
  uint32_t beforePos;
  uint32_t *epFineStartAddr;
  M2TSStreamInfo *streamInfo_local;
  BitStreamWriter *writer_local;
  CLPIParser *this_local;
  
  puVar5 = BitStream::getBuffer(&writer->super_BitStream);
  iVar2 = BitStreamWriter::getBitsCount(writer);
  iVar3 = BitStreamWriter::getBitsCount(writer);
  coarseInfo.super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = iVar3 / 8;
  BitStreamWriter::putBits(writer,0x20,0);
  buildCoarseInfo((vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> *)&__range1,this,
                  streamInfo);
  __end1 = std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>::begin
                     ((vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> *)&__range1);
  i = (BluRayCoarseInfo *)
      std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>::end
                ((vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> *)&__range1);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_BluRayCoarseInfo_*,_std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>_>
                                     *)&i), bVar1) {
    pBVar6 = __gnu_cxx::
             __normal_iterator<const_BluRayCoarseInfo_*,_std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>_>
             ::operator*(&__end1);
    BitStreamWriter::putBits(writer,0x12,pBVar6->m_fineRefID);
    BitStreamWriter::putBits(writer,0xe,pBVar6->m_coarsePts);
    BitStreamWriter::putBits(writer,0x20,pBVar6->m_pktCnt);
    __gnu_cxx::
    __normal_iterator<const_BluRayCoarseInfo_*,_std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>_>
    ::operator++(&__end1);
  }
  iVar3 = BitStreamWriter::getBitsCount(writer);
  if (iVar3 % 0x10 != 0) {
    BitStreamWriter::putBits(writer,8,0);
  }
  iVar3 = BitStreamWriter::getBitsCount(writer);
  if (iVar3 < 0) {
    iVar3 = iVar3 + 7;
  }
  uVar4 = my_ntohl((iVar3 >> 3) -
                   coarseInfo.
                   super__Vector_base<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_);
  *(uint32_t *)(puVar5 + iVar2 / 8) = uVar4;
  bVar1 = std::
          vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
          ::empty(&streamInfo->m_index);
  if (!bVar1) {
    this_00 = std::
              vector<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
              ::operator[](&streamInfo->m_index,this->m_clpiNum);
    __end2 = std::
             map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
             ::begin(this_00);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>
         ::end(this_00);
    while (bVar1 = std::operator!=(&__end2,&local_98), bVar1) {
      __in = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::operator*
                       (&__end2);
      ptVar7 = std::get<0ul,unsigned_long_const,PMTIndexData>(__in);
      ptVar8 = std::get<1ul,unsigned_long_const,PMTIndexData>(__in);
      BitStreamWriter::putBit(writer,0);
      local_bc = 0;
      if (ptVar8->m_frameLen != 0) {
        bVar1 = is4K();
        if (bVar1) {
          if (ptVar8->m_frameLen < 0xc0000) {
            local_bc = 1;
          }
          else if (ptVar8->m_frameLen < 0x180000) {
            local_bc = 2;
          }
          else if (ptVar8->m_frameLen < 0x240000) {
            local_bc = 3;
          }
          else if (ptVar8->m_frameLen < 0x300000) {
            local_bc = 4;
          }
          else if (ptVar8->m_frameLen < 0x3c0000) {
            local_bc = 5;
          }
          else if (ptVar8->m_frameLen < 0x480000) {
            local_bc = 6;
          }
          else {
            local_bc = 7;
          }
        }
        else if (ptVar8->m_frameLen < 0x20000) {
          local_bc = 1;
        }
        else if (ptVar8->m_frameLen < 0x40000) {
          local_bc = 2;
        }
        else if (ptVar8->m_frameLen < 0x60000) {
          local_bc = 3;
        }
        else if (ptVar8->m_frameLen < 0x90000) {
          local_bc = 4;
        }
        else if (ptVar8->m_frameLen < 0xe0000) {
          local_bc = 5;
        }
        else if (ptVar8->m_frameLen < 0x140000) {
          local_bc = 6;
        }
        else {
          local_bc = 7;
        }
      }
      BitStreamWriter::putBits(writer,3,local_bc);
      BitStreamWriter::putBits(writer,0xb,(uint)*ptVar7 >> 9 & 0x7ff);
      BitStreamWriter::putBits(writer,0x11,ptVar8->m_pktCnt & 0x1ffff);
      std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_PMTIndexData>_>::operator++
                (&__end2);
    }
  }
  std::vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_>::~vector
            ((vector<BluRayCoarseInfo,_std::allocator<BluRayCoarseInfo>_> *)&__range1);
  return;
}

Assistant:

void CLPIParser::composeEP_map_for_one_stream_PID(BitStreamWriter& writer, M2TSStreamInfo& streamInfo) const
{
    const auto epFineStartAddr = reinterpret_cast<uint32_t*>(writer.getBuffer() + writer.getBitsCount() / 8);
    const uint32_t beforePos = writer.getBitsCount() / 8;
    writer.putBits(32, 0);  // EP_fine_table_start_address
    const std::vector<BluRayCoarseInfo> coarseInfo = buildCoarseInfo(streamInfo);
    for (const auto& i : coarseInfo)
    {
        writer.putBits(18, i.m_fineRefID);  // ref_to_EP_fine_id[i]
        writer.putBits(14, i.m_coarsePts);  // PTS_EP_coarse[i]
        writer.putBits(32, i.m_pktCnt);     // SPN_EP_coarse[i]
    }
    if (writer.getBitsCount() % 16 != 0)
        writer.putBits(8, 0);  // padding_word
    *epFineStartAddr = my_htonl(writer.getBitsCount() / 8 - beforePos);
    if (!streamInfo.m_index.empty())
    {
        const PMTIndex& curIndex = streamInfo.m_index[m_clpiNum];
        for (const auto& [fst, snd] : curIndex)
        {
            const PMTIndexData& indexData = snd;
            writer.putBit(0);  // is_angle_change_point[EP_fine_id]
            int endCode = 0;
            if (indexData.m_frameLen > 0)
            {
                if (is4K())
                {
                    if (indexData.m_frameLen < 786432)
                        endCode = 1;
                    else if (indexData.m_frameLen < 1572864)
                        endCode = 2;
                    else if (indexData.m_frameLen < 2359296)
                        endCode = 3;
                    else if (indexData.m_frameLen < 3145728)
                        endCode = 4;
                    else if (indexData.m_frameLen < 3932160)
                        endCode = 5;
                    else if (indexData.m_frameLen < 4718592)
                        endCode = 6;
                    else
                        endCode = 7;
                }
                else
                {
                    if (indexData.m_frameLen < 131072)
                        endCode = 1;
                    else if (indexData.m_frameLen < 262144)
                        endCode = 2;
                    else if (indexData.m_frameLen < 393216)
                        endCode = 3;
                    else if (indexData.m_frameLen < 589824)
                        endCode = 4;
                    else if (indexData.m_frameLen < 917504)
                        endCode = 5;
                    else if (indexData.m_frameLen < 1310720)
                        endCode = 6;
                    else
                        endCode = 7;
                }
            }
            writer.putBits(3, endCode);                          // I_end_position_offset[EP_fine_id]
            writer.putBits(11, (fst >> 9) % (1 << 11));          // PTS_EP_fine[EP_fine_id]
            writer.putBits(17, indexData.m_pktCnt % (1 << 17));  // SPN_EP_fine[EP_fine_id]
        }
    }
}